

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.cpp
# Opt level: O1

bool camp::test::array::data(void)

{
  return true;
}

Assistant:

CAMP_TEST_BEGIN(array, data)
{
   camp::array<int, 2> a = {1, 8};
   int* a_data = a.data();

   const camp::array<int, 2>& b{a};
   const int* b_data = b.data();

   bool passed = a_data[0] == 1 &&
                 a_data[1] == 8 &&
                 b_data[0] == 1 &&
                 b_data[1] == 8;

   a_data[0] = 3;

   return passed &&
          a_data[0] == 3 &&
          a_data[1] == 8 &&
          b_data[0] == 3 &&
          b_data[1] == 8;
}